

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

char * loguru::home_dir(void)

{
  char *pcVar1;
  char *home;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 == (char *)0x0) {
    log_and_abort(0,"CHECK FAILED:  home != nullptr  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x288,"Missing HOME");
  }
  return pcVar1;
}

Assistant:

const char* home_dir()
	{
		#ifdef _WIN32
			auto user_profile = getenv("USERPROFILE");
			CHECK_F(user_profile != nullptr, "Missing USERPROFILE");
			return user_profile;
		#else // _WIN32
			auto home = getenv("HOME");
			CHECK_F(home != nullptr, "Missing HOME");
			return home;
		#endif // _WIN32
	}